

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.h
# Opt level: O2

void __thiscall
nnad::Matrix<double>::Matrix
          (Matrix<double> *this,int *Lines,int *Columns,
          vector<double,_std::allocator<double>_> *Entries)

{
  allocator<char> local_39;
  string local_38;
  
  this->_Lines = *Lines;
  this->_Columns = *Columns;
  std::vector<double,_std::allocator<double>_>::vector(&this->_Matrix,Entries);
  if (this->_Columns * this->_Lines !=
      (int)((ulong)((long)(Entries->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                          super__Vector_impl_data._M_finish -
                   (long)(Entries->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data._M_start) >> 3)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,
               "Matrix: the size of the input vector does not match the size of the matrix.",
               &local_39);
    Error(&local_38);
    std::__cxx11::string::~string((string *)&local_38);
  }
  return;
}

Assistant:

Matrix(int const& Lines, int const& Columns, std::vector<T> const& Entries):
      _Lines(Lines),
      _Columns(Columns),
      _Matrix(Entries)
    {
      // Check that the size of the Entries match the size of the
      // matrix.
      if (_Lines * _Columns != (int) Entries.size())
        Error("Matrix: the size of the input vector does not match the size of the matrix.");
    }